

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

tuple __thiscall
pybind11::make_tuple<(pybind11::return_value_policy)1,char_const(&)[4],char_const(&)[4]>
          (pybind11 *this,char (*args_) [4],char (*args__1) [4])

{
  undefined8 uVar1;
  long lVar2;
  runtime_error *this_00;
  long *plVar3;
  long *plVar4;
  array<pybind11::object,_2UL> args;
  object local_90;
  long local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_90.super_handle.m_ptr = (handle)PyUnicode_FromString(args_);
  local_88 = PyUnicode_FromString(args__1);
  if ((local_90.super_handle.m_ptr != (PyObject *)0x0) && (local_88 != 0)) {
    tuple::tuple((tuple *)this,2);
    lVar2 = 0;
    do {
      uVar1 = *(undefined8 *)((long)&local_90.super_handle.m_ptr + lVar2);
      *(undefined8 *)((long)&local_90.super_handle.m_ptr + lVar2) = 0;
      if ((*(byte *)(*(long *)(*(long *)this + 8) + 0xab) & 4) == 0) {
        __assert_fail("PyTuple_Check(result.ptr())",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/benikabocha[P]py_embedded_sample/external/pybind11/include/pybind11/cast.h"
                      ,0x496,
                      "tuple pybind11::make_tuple(Args &&...) [policy = pybind11::return_value_policy::automatic_reference, Args = <const char (&)[4], const char (&)[4]>]"
                     );
      }
      *(undefined8 *)(*(long *)this + 0x18 + lVar2) = uVar1;
      lVar2 = lVar2 + 8;
    } while (lVar2 != 0x10);
    lVar2 = 8;
    do {
      object::~object((object *)((long)&local_90.super_handle.m_ptr + lVar2));
      lVar2 = lVar2 + -8;
    } while (lVar2 != -8);
    return (object)(object)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  type_id<std::tuple<char_const(&)[4],char_const(&)[4]>>();
  std::operator+(&local_40,"make_tuple(): unable to convert arguments of types \'",&local_80);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_60 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_60 == plVar4) {
    local_50 = *plVar4;
    lStack_48 = plVar3[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar4;
  }
  local_58 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_60);
  *(undefined ***)this_00 = &PTR__runtime_error_0010cd00;
  __cxa_throw(this_00,&cast_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

tuple make_tuple(Args&&... args_) {
    const size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (auto &arg_value : args) {
        if (!arg_value) {
#if defined(NDEBUG)
            throw cast_error("make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)");
#else
            throw cast_error("make_tuple(): unable to convert arguments of types '" +
                (std::string) type_id<std::tuple<Args...>>() + "' to Python object");
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}